

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O1

void armci_msg_bcast_scope(int scope,void *buffer,int len,int root)

{
  MPI_Comm in_RAX;
  MPI_Comm comm;
  MPI_Comm local_28;
  
  if (scope != 0x153) {
    if (scope == 0x151) {
      if (buffer != (void *)0x0) {
        local_28 = in_RAX;
        comex_group_comm(ARMCI_Node_group,&local_28);
        MPI_Bcast(buffer,len,&ompi_mpi_byte,root,local_28);
        return;
      }
      __assert_fail("buffer != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/message.c"
                    ,0x14e,"void armci_msg_bcast_scope(int, void *, int, int)");
    }
    if (scope != 0x14d) {
      comex_error("unsupported armci_msg_bcast_scope scope",1);
      return;
    }
  }
  armci_msg_bcast(buffer,len,root);
  return;
}

Assistant:

void armci_msg_bcast_scope(int scope, void* buffer, int len, int root)
{
    if (SCOPE_ALL == scope || SCOPE_MASTERS == scope) {
        armci_msg_bcast(buffer, len, root);
    }
    else if (SCOPE_NODE == scope) {
        MPI_Comm comm;
        assert(buffer != NULL);
        comex_group_comm(ARMCI_Node_group,&comm);
        MPI_Bcast(buffer, len, MPI_BYTE, root, comm);
    }
    else {
        comex_error("unsupported armci_msg_bcast_scope scope", 1);
    }
}